

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void prvTidyDefinePriorityAttribute(TidyDocImpl *doc,ctmbstr name)

{
  PriorityAttribs *pPVar1;
  tmbstr *pptVar2;
  tmbstr ptVar3;
  PriorityAttribs *priorities;
  ctmbstr name_local;
  TidyDocImpl *doc_local;
  
  pPVar1 = &(doc->attribs).priorityAttribs;
  if (pPVar1->list == (tmbstr *)0x0) {
    pptVar2 = (tmbstr *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x50);
    pPVar1->list = pptVar2;
    *pPVar1->list = (tmbstr)0x0;
    (doc->attribs).priorityAttribs.capacity = 10;
    (doc->attribs).priorityAttribs.count = 0;
  }
  if ((doc->attribs).priorityAttribs.capacity <= (doc->attribs).priorityAttribs.count) {
    (doc->attribs).priorityAttribs.capacity = (doc->attribs).priorityAttribs.capacity << 1;
    pptVar2 = (tmbstr *)
              (*doc->allocator->vtbl->realloc)
                        (doc->allocator,pPVar1->list,
                         (ulong)(doc->attribs).priorityAttribs.capacity * 8 + 1);
    pPVar1->list = pptVar2;
  }
  ptVar3 = prvTidytmbstrdup(doc->allocator,name);
  pPVar1->list[(doc->attribs).priorityAttribs.count] = ptVar3;
  (doc->attribs).priorityAttribs.count = (doc->attribs).priorityAttribs.count + 1;
  pPVar1->list[(doc->attribs).priorityAttribs.count] = (tmbstr)0x0;
  return;
}

Assistant:

void TY_(DefinePriorityAttribute)(TidyDocImpl* doc, ctmbstr name)
{
    enum { capacity = 10 };
    PriorityAttribs *priorities = &(doc->attribs.priorityAttribs);

    if ( !priorities->list )
    {
        priorities->list = TidyAlloc(doc->allocator, sizeof(ctmbstr) * capacity );
        priorities->list[0] = NULL;
        priorities->capacity = capacity;
        priorities->count = 0;
    }

    if ( priorities->count >= priorities->capacity )
    {
        priorities->capacity = priorities->capacity * 2;
        priorities->list = TidyRealloc(doc->allocator, priorities->list, sizeof(tmbstr) * priorities->capacity + 1 );
    }

    priorities->list[priorities->count] = TY_(tmbstrdup)( doc->allocator, name);
    priorities->count++;
    priorities->list[priorities->count] = NULL;
}